

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extinfo.h
# Opt level: O3

void server::extserverinforeply(ucharbuf *req,ucharbuf *p)

{
  int iVar1;
  uint n;
  long lVar2;
  clientinfo *ci;
  ucharbuf q;
  ucharbuf local_38;
  
  iVar1 = getint(req);
  putint(p,-1);
  putint(p,0x69);
  if (iVar1 == 2) {
    extinfoteams(p);
    goto LAB_001440ed;
  }
  if (iVar1 == 1) {
    iVar1 = getint(req);
    if (iVar1 < 0) {
      ci = (clientinfo *)0x0;
LAB_00144102:
      putint(p,0);
      local_38.flags = p->flags;
      local_38._17_7_ = *(undefined7 *)&p->field_0x11;
      local_38.buf = p->buf;
      local_38.len = p->len;
      local_38.maxlen = p->maxlen;
      putint(&local_38,-10);
      if (ci == (clientinfo *)0x0) {
        if (0 < DAT_00193844) {
          lVar2 = 0;
          do {
            putint(&local_38,*(int *)(*(long *)(clients + lVar2 * 8) + 8));
            lVar2 = lVar2 + 1;
          } while (lVar2 < DAT_00193844);
        }
        sendserverinforeply(&local_38);
        if (0 < DAT_00193844) {
          lVar2 = 0;
          do {
            extinfoplayer(p,*(clientinfo **)(clients + lVar2 * 8));
            lVar2 = lVar2 + 1;
          } while (lVar2 < DAT_00193844);
        }
      }
      else {
        putint(&local_38,ci->clientnum);
        sendserverinforeply(&local_38);
        extinfoplayer(p,ci);
      }
      return;
    }
    if (0 < (long)DAT_00193844) {
      lVar2 = 0;
      do {
        ci = *(clientinfo **)(clients + lVar2 * 8);
        if (ci->clientnum == iVar1) goto LAB_00144102;
        lVar2 = lVar2 + 1;
      } while (DAT_00193844 != lVar2);
    }
LAB_001440d6:
    n = 1;
  }
  else {
    n = totalsecs;
    if (iVar1 != 0) goto LAB_001440d6;
  }
  putint(p,n);
LAB_001440ed:
  sendserverinforeply(p);
  return;
}

Assistant:

void extserverinforeply(ucharbuf &req, ucharbuf &p)
    {
        int extcmd = getint(req); // extended commands  

        //Build a new packet
        putint(p, EXT_ACK); //send ack
        putint(p, EXT_VERSION); //send version of extended info

        switch(extcmd)
        {
            case EXT_UPTIME:
            {
                putint(p, totalsecs); //in seconds
                break;
            }

            case EXT_PLAYERSTATS:
            {
                int cn = getint(req); //a special player, -1 for all
                
                clientinfo *ci = NULL;
                if(cn >= 0)
                {
                    loopv(clients) if(clients[i]->clientnum == cn) { ci = clients[i]; break; }
                    if(!ci)
                    {
                        putint(p, EXT_ERROR); //client requested by id was not found
                        sendserverinforeply(p);
                        return;
                    }
                }

                putint(p, EXT_NO_ERROR); //so far no error can happen anymore
                
                ucharbuf q = p; //remember buffer position
                putint(q, EXT_PLAYERSTATS_RESP_IDS); //send player ids following
                if(ci) putint(q, ci->clientnum);
                else loopv(clients) putint(q, clients[i]->clientnum);
                sendserverinforeply(q);
            
                if(ci) extinfoplayer(p, ci);
                else loopv(clients) extinfoplayer(p, clients[i]);
                return;
            }

            case EXT_TEAMSCORE:
            {
                extinfoteams(p);
                break;
            }

            default:
            {
                putint(p, EXT_ERROR);
                break;
            }
        }
        sendserverinforeply(p);
    }